

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator.cpp
# Opt level: O2

void __thiscall duckdb::LogicalOperator::PrintColumnBindings(LogicalOperator *this)

{
  vector<duckdb::ColumnBinding,_true> *bindings;
  undefined1 local_40 [24];
  string local_28;
  
  (*this->_vptr_LogicalOperator[2])((LogicalOperator *)local_40,this);
  ColumnBindingsToString_abi_cxx11_
            ((string *)(local_40 + 0x18),(LogicalOperator *)local_40,bindings);
  Printer::Print((string *)(local_40 + 0x18));
  ::std::__cxx11::string::~string((string *)(local_40 + 0x18));
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            ((_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> *)local_40
            );
  return;
}

Assistant:

void LogicalOperator::PrintColumnBindings() {
	Printer::Print(ColumnBindingsToString(GetColumnBindings()));
}